

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ClearLog(ExampleAppConsole *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < (this->Items).Size; lVar1 = lVar1 + 1) {
    free((this->Items).Data[lVar1]);
  }
  ImVector<char_*>::clear(&this->Items);
  return;
}

Assistant:

void    ClearLog()
    {
        for (int i = 0; i < Items.Size; i++)
            free(Items[i]);
        Items.clear();
    }